

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O0

Dec_Edge_t Dec_FactorTrivialTree_rec(Dec_Graph_t *pFForm,Dec_Edge_t *peNodes,int nNodes,int fNodeOr)

{
  int nNodes_00;
  Dec_Edge_t eEdge0;
  Dec_Edge_t eEdge1;
  int nNodes2;
  int nNodes1;
  Dec_Edge_t eNode2;
  Dec_Edge_t eNode1;
  int fNodeOr_local;
  int nNodes_local;
  Dec_Edge_t *peNodes_local;
  Dec_Graph_t *pFForm_local;
  
  if (nNodes == 1) {
    pFForm_local._4_4_ = *peNodes;
  }
  else {
    nNodes_00 = nNodes / 2;
    eEdge0 = Dec_FactorTrivialTree_rec(pFForm,peNodes,nNodes_00,fNodeOr);
    eEdge1 = Dec_FactorTrivialTree_rec(pFForm,peNodes + nNodes_00,nNodes - nNodes_00,fNodeOr);
    if (fNodeOr == 0) {
      pFForm_local._4_4_ = Dec_GraphAddNodeAnd(pFForm,eEdge0,eEdge1);
    }
    else {
      pFForm_local._4_4_ = Dec_GraphAddNodeOr(pFForm,eEdge0,eEdge1);
    }
  }
  return pFForm_local._4_4_;
}

Assistant:

Dec_Edge_t Dec_FactorTrivialTree_rec( Dec_Graph_t * pFForm, Dec_Edge_t * peNodes, int nNodes, int fNodeOr )
{
    Dec_Edge_t eNode1, eNode2;
    int nNodes1, nNodes2;

    if ( nNodes == 1 )
        return peNodes[0];

    // split the nodes into two parts
    nNodes1 = nNodes/2;
    nNodes2 = nNodes - nNodes1;
//    nNodes2 = nNodes/2;
//    nNodes1 = nNodes - nNodes2;

    // recursively construct the tree for the parts
    eNode1 = Dec_FactorTrivialTree_rec( pFForm, peNodes,           nNodes1, fNodeOr );
    eNode2 = Dec_FactorTrivialTree_rec( pFForm, peNodes + nNodes1, nNodes2, fNodeOr );

    if ( fNodeOr )
        return Dec_GraphAddNodeOr( pFForm, eNode1, eNode2 );
    else
        return Dec_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}